

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O3

void __thiscall
FThinkerIterator::FThinkerIterator(FThinkerIterator *this,PClass *type,int statnum,DThinker *prev)

{
  DThinker *pDVar1;
  uint uVar2;
  
  uVar2 = 0x20;
  if ((uint)statnum < 0x80) {
    uVar2 = statnum;
  }
  this->m_Stat = (BYTE)uVar2;
  this->m_SearchStats = 0x7f < (uint)statnum;
  this->m_ParentType = type;
  if ((prev == (DThinker *)0x0) ||
     (pDVar1 = prev->NextThinker, ((pDVar1->super_DObject).ObjectFlags & 0x400) != 0)) {
    pDVar1 = FThinkerList::GetHead(DThinker::Thinkers + (uVar2 & 0xff));
  }
  this->m_CurrThinker = pDVar1;
  this->m_SearchingFresh = false;
  return;
}

Assistant:

FThinkerIterator::FThinkerIterator (const PClass *type, int statnum, DThinker *prev)
{
	if ((unsigned)statnum > MAX_STATNUM)
	{
		m_Stat = STAT_FIRST_THINKING;
		m_SearchStats = true;
	}
	else
	{
		m_Stat = statnum;
		m_SearchStats = false;
	}
	m_ParentType = type;
	if (prev == NULL || (prev->NextThinker->ObjectFlags & OF_Sentinel))
	{
		Reinit();
	}
	else
	{
		m_CurrThinker = prev->NextThinker;
		m_SearchingFresh = false;
	}
}